

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void ConvertRowToY(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,uint8_t *dst_y,int width,
                  VP8Random *rg)

{
  int iVar1;
  int in_ECX;
  long in_R8;
  int in_R9D;
  int j;
  int i;
  int iVar2;
  int in_stack_ffffffffffffffe0;
  
  for (iVar2 = 0; iVar2 < in_R9D; iVar2 = iVar2 + 1) {
    iVar1 = RGBToY(in_ECX,in_stack_ffffffffffffffe0,(int)((ulong)in_R8 >> 0x20),
                   (VP8Random *)CONCAT44(in_R9D,iVar2));
    *(char *)(in_R8 + iVar2) = (char)iVar1;
  }
  return;
}

Assistant:

static WEBP_INLINE void ConvertRowToY(const uint8_t* const r_ptr,
                                      const uint8_t* const g_ptr,
                                      const uint8_t* const b_ptr,
                                      int step,
                                      uint8_t* const dst_y,
                                      int width,
                                      VP8Random* const rg) {
  int i, j;
  for (i = 0, j = 0; i < width; i += 1, j += step) {
    dst_y[i] = RGBToY(r_ptr[j], g_ptr[j], b_ptr[j], rg);
  }
}